

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O3

string * fs_win32_final_path_abi_cxx11_(string *__return_storage_ptr__,string_view path)

{
  string_view fname;
  error_code local_28;
  
  local_28._M_cat = (error_category *)std::_V2::generic_category();
  local_28._M_value = 0x26;
  fname._M_str = "fs_win32_final_path";
  fname._M_len = 0x13;
  fs_print_error(path,fname,&local_28);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string fs_win32_final_path(std::string_view path)
{
  // resolves Windows symbolic links (reparse points and junctions)
  // it also resolves the case insensitivity of Windows paths to the disk case
  // PATH MUST EXIST
  //
  // References:
  // https://stackoverflow.com/a/50182947
  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-createfilea
  // https://learn.microsoft.com/en-us/windows/win32/api/fileapi/nf-fileapi-getfinalpathnamebyhandlea

  std::error_code ec;

#if defined(_WIN32)
  if(fs_trace) std::cout << "TRACE: win32_final_path(" << path << ")\n";
  // dwDesiredAccess=0 to allow getting parameters even without read permission
  // FILE_FLAG_BACKUP_SEMANTICS required to open a directory
  HANDLE h = CreateFileA(path.data(), GENERIC_READ, FILE_SHARE_READ, nullptr,
              OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, nullptr);
  if(h == INVALID_HANDLE_VALUE)
    return {};

  std::string r(fs_get_max_path(), '\0');

  if(DWORD L = GetFinalPathNameByHandleA(h, r.data(), static_cast<DWORD>(r.size()), FILE_NAME_NORMALIZED);
      CloseHandle(h) && L) {
    r.resize(L);

#ifdef __cpp_lib_starts_ends_with  // C++20
    if (r.starts_with(R"(\\?\)"))
#else  // C++98
    if (r.substr(0, 4) == R"(\\?\)")
#endif
      r = r.substr(4);

    return fs_as_posix(r);
  }
#else
  ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(path, __func__, ec);
  return {};
}